

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O0

void __thiscall leveldb::FilterBlockBuilder::AddKey(FilterBlockBuilder *this,Slice *key)

{
  char *pcVar1;
  value_type local_30;
  undefined1 local_28 [8];
  Slice k;
  Slice *key_local;
  FilterBlockBuilder *this_local;
  
  local_28 = (undefined1  [8])key->data_;
  k.data_ = (char *)key->size_;
  k.size_ = (size_t)key;
  local_30 = std::__cxx11::string::size();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->start_,&local_30);
  pcVar1 = Slice::data((Slice *)local_28);
  Slice::size((Slice *)local_28);
  std::__cxx11::string::append((char *)&this->keys_,(ulong)pcVar1);
  return;
}

Assistant:

void FilterBlockBuilder::AddKey(const Slice& key) {
  Slice k = key;
  start_.push_back(keys_.size());
  keys_.append(k.data(), k.size());
}